

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdp.h
# Opt level: O0

void __thiscall CMDPSTATE::~CMDPSTATE(CMDPSTATE *this)

{
  SBPL_Exception *this_00;
  long in_RDI;
  char *msg;
  char *in_stack_ffffffffffffffd8;
  vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_> *in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x38) != 0) {
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_00,in_stack_ffffffffffffffd8);
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffff0);
  std::vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>::~vector(in_stack_fffffffffffffff0);
  return;
}

Assistant:

~CMDPSTATE()
    {
        if (PlannerSpecificData != NULL) {
            const char* msg = "ERROR: state deletion: planner specific data is not deleted";
            SBPL_FPRINTF(stderr, "%s\n", msg);
            throw SBPL_Exception(msg);
        }
    }